

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac_drbg.c
# Opt level: O0

int mbedtls_hmac_drbg_update_seed_file(mbedtls_hmac_drbg_context *ctx,char *path)

{
  FILE *__stream;
  ulong __n;
  size_t sVar1;
  uchar local_138 [8];
  uchar buf [256];
  size_t n;
  FILE *f;
  char *path_local;
  mbedtls_hmac_drbg_context *ctx_local;
  
  __stream = fopen(path,"rb");
  if (__stream == (FILE *)0x0) {
    ctx_local._4_4_ = -7;
  }
  else {
    fseek(__stream,0,2);
    __n = ftell(__stream);
    fseek(__stream,0,0);
    if (__n < 0x101) {
      sVar1 = fread(local_138,1,__n,__stream);
      if (sVar1 == __n) {
        fclose(__stream);
        mbedtls_hmac_drbg_update(ctx,local_138,__n);
        ctx_local._4_4_ = mbedtls_hmac_drbg_write_seed_file(ctx,path);
      }
      else {
        fclose(__stream);
        ctx_local._4_4_ = -7;
      }
    }
    else {
      fclose(__stream);
      ctx_local._4_4_ = -5;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_hmac_drbg_update_seed_file( mbedtls_hmac_drbg_context *ctx, const char *path )
{
    FILE *f;
    size_t n;
    unsigned char buf[ MBEDTLS_HMAC_DRBG_MAX_INPUT ];

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR );

    fseek( f, 0, SEEK_END );
    n = (size_t) ftell( f );
    fseek( f, 0, SEEK_SET );

    if( n > MBEDTLS_HMAC_DRBG_MAX_INPUT )
    {
        fclose( f );
        return( MBEDTLS_ERR_HMAC_DRBG_INPUT_TOO_BIG );
    }

    if( fread( buf, 1, n, f ) != n )
    {
        fclose( f );
        return( MBEDTLS_ERR_HMAC_DRBG_FILE_IO_ERROR );
    }

    fclose( f );

    mbedtls_hmac_drbg_update( ctx, buf, n );

    return( mbedtls_hmac_drbg_write_seed_file( ctx, path ) );
}